

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

void vecPrint(char *s,cupdlp_float *a,cupdlp_int n)

{
  ulong uVar1;
  
  printf("%s: ",s);
  if (0 < n) {
    uVar1 = 0;
    do {
      printf("%.3f ",a[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  putchar(10);
  return;
}

Assistant:

void vecPrint(const char *s, const cupdlp_float *a, cupdlp_int n) {
  cupdlp_printf("%s: ", s);
  for (cupdlp_int i = 0; i < n; ++i) {
    cupdlp_printf("%.3f ", a[i]);
  }
  cupdlp_printf("\n");
}